

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void LiteScript::Instruction::SaveBinary
               (ostream *stream,
               vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instr)

{
  ostream *poVar1;
  uchar uVar2;
  OStreamer OVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  OStreamer streamer;
  
  streamer.stream = stream;
  std::ostream::_M_insert<unsigned_long>((ulong)stream);
  uVar4 = (ulong)((long)(instr->
                        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(instr->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
  lVar5 = 8;
  do {
    bVar6 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar6) {
      return;
    }
    std::operator<<(stream,*(char *)((long)(instr->
                                           super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar5 + -8))
    ;
    switch(*(undefined1 *)
            ((long)(instr->
                   super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar5 + -7)) {
    case 1:
      std::operator<<(streamer.stream,'\x01');
      uVar2 = (&((instr->
                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                 )._M_impl.super__Vector_impl_data._M_start)->code)[lVar5];
      OVar3 = streamer;
      goto LAB_0012df1c;
    case 2:
      std::operator<<(streamer.stream,'\x02');
      OStreamer::operator<<
                (&streamer,
                 (int *)(&((instr->
                           super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                           )._M_impl.super__Vector_impl_data._M_start)->code + lVar5));
      break;
    case 3:
      std::operator<<(streamer.stream,'\x03');
      OStreamer::operator<<
                (&streamer,
                 (float *)(&((instr->
                             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             )._M_impl.super__Vector_impl_data._M_start)->code + lVar5));
      break;
    case 4:
      poVar1 = std::operator<<(stream,'\x04');
      std::operator<<(poVar1,*(char **)(&((instr->
                                          super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->code + lVar5)
                     );
    default:
      uVar2 = '\0';
      OVar3.stream = stream;
LAB_0012df1c:
      std::operator<<(OVar3.stream,uVar2);
    }
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

void LiteScript::Instruction::SaveBinary(std::ostream &stream, const std::vector<Instruction> &instr) {
    OStreamer streamer(stream);
    streamer << instr.size();
    for (unsigned int i = 0, sz = instr.size(); i < sz; i++) {
        stream << instr[i].code;
        switch (instr[i].comp_type) {
            case CompType::COMP_TYPE_BOOLEAN:
                streamer << (unsigned char)1 << (unsigned char)instr[i].comp_value.v_boolean;
                break;
            case CompType::COMP_TYPE_INTEGER:
                streamer << (unsigned char)2 << instr[i].comp_value.v_integer;
                break;
            case CompType::COMP_TYPE_FLOAT:
                streamer << (unsigned char)3 << instr[i].comp_value.v_float;
                break;
            case CompType::COMP_TYPE_STRING:
                stream << (unsigned char)4 << instr[i].comp_value.v_string;
            default:
                stream << (unsigned char)0;
        }
    }
}